

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_astTupleSlotNamedAtPutNode_primitiveCompileIntoBytecode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  anon_struct_32_4_d81886b1 gcFrame;
  sysbvm_tuple_t local_58;
  sysbvm_tuple_t sStack_50;
  sysbvm_tuple_t local_48;
  sysbvm_tuple_t sStack_40;
  sysbvm_stackFrameRecord_t local_38;
  undefined8 local_28;
  undefined1 *puStack_20;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_48 = 0;
  sStack_40 = 0;
  local_58 = 0;
  sStack_50 = 0;
  local_38.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_38.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_38._12_4_ = 0;
  local_28 = 4;
  puStack_20 = (undefined1 *)&local_58;
  sysbvm_stackFrame_pushRecord(&local_38);
  local_58 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                       (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
                        *(sysbvm_tuple_t *)(*arguments + 0x28));
  sStack_50 = sysbvm_functionBytecodeAssembler_addLiteral
                        (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),
                         *(sysbvm_tuple_t *)(*arguments + 0x40));
  local_48 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                       (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
                        *(sysbvm_tuple_t *)(*arguments + 0x38));
  uVar1 = *(ulong *)(*arguments + 0x28);
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    uVar1 = *(ulong *)(uVar1 + 0x20);
  }
  else {
    uVar1 = 0;
  }
  if (((uVar1 & 0xf) == 0 && uVar1 != 0) && ((*(byte *)(uVar1 + 8) & 0x80) == 0)) {
    uVar1 = *(ulong *)(uVar1 + 0x70);
    if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
      uVar1 = (long)uVar1 >> 4;
    }
    else {
      uVar1 = *(ulong *)(uVar1 + 0x10);
    }
  }
  else {
    uVar1 = 0;
  }
  if ((uVar1 & 0xe00) == 0) {
    sysbvm_functionBytecodeAssembler_slotAtPut
              (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),local_58,
               sStack_50,local_48);
  }
  else {
    sysbvm_functionBytecodeAssembler_refSlotAtPut
              (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),local_58,
               sStack_50,local_48);
  }
  sStack_40 = sysbvm_functionBytecodeAssembler_addLiteral
                        (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),0x2f)
  ;
  sysbvm_stackFrame_popRecord(&local_38);
  return sStack_40;
}

Assistant:

static sysbvm_tuple_t sysbvm_astTupleSlotNamedAtPutNode_primitiveCompileIntoBytecode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_functionBytecodeDirectCompiler_t **compiler = (sysbvm_functionBytecodeDirectCompiler_t **)&arguments[1];

    sysbvm_astTupleSlotNamedAtPutNode_t **slotNamedNode = (sysbvm_astTupleSlotNamedAtPutNode_t**)node;
    struct {
        sysbvm_tuple_t tuple;
        sysbvm_tuple_t slot;
        sysbvm_tuple_t value;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.tuple = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*slotNamedNode)->tupleExpression);
    gcFrame.slot = sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, (*slotNamedNode)->boundSlot);
    gcFrame.value = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*slotNamedNode)->valueExpression);
    if(sysbvm_type_isPointerLikeType(sysbvm_astNode_getAnalyzedType((*slotNamedNode)->tupleExpression)))
        sysbvm_functionBytecodeAssembler_refSlotAtPut(context, (*compiler)->assembler, gcFrame.tuple, gcFrame.slot, gcFrame.value);
    else
        sysbvm_functionBytecodeAssembler_slotAtPut(context, (*compiler)->assembler, gcFrame.tuple, gcFrame.slot, gcFrame.value);

    gcFrame.result = sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, SYSBVM_VOID_TUPLE);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}